

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classify-symbols.cc
# Opt level: O2

void __thiscall ClassifySymbols::operator()(ClassifySymbols *this,Grammar *grammar)

{
  _Rb_tree_node_base *__k;
  iterator iVar1;
  iterator iVar2;
  _Base_ptr p_Var3;
  
  (*(this->super_Visitor)._vptr_Visitor[2])();
  for (p_Var3 = (grammar->names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(grammar->names)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    __k = p_Var3 + 1;
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(grammar->non_terminals)._M_t,(key_type *)__k);
    if ((_Rb_tree_header *)iVar1._M_node ==
        &(grammar->non_terminals)._M_t._M_impl.super__Rb_tree_header) {
      iVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&(grammar->externals)._M_t,(key_type *)__k);
      if ((_Rb_tree_header *)iVar2._M_node ==
          &(grammar->externals)._M_t._M_impl.super__Rb_tree_header) {
        iVar1 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&(grammar->terminals)._M_t,(key_type *)__k);
        if ((_Rb_tree_header *)iVar1._M_node ==
            &(grammar->terminals)._M_t._M_impl.super__Rb_tree_header) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&grammar->undef,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
        }
      }
    }
  }
  for (p_Var3 = (grammar->undef)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(grammar->undef)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    fmt::v7::print<char[22],std::__cxx11::string_const&,char>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
               (char (*) [22])"undefined symbol \'{}\'",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1));
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  }
  return;
}

Assistant:

void ClassifySymbols::operator()(ast::Grammar* grammar) {
  grammar->accept(this);

  for (auto&& n : grammar->names) {
    if (grammar->non_terminals.find(n) != grammar->non_terminals.end())
      continue;

    if (grammar->externals.find(n) != grammar->externals.end()) continue;

    if (grammar->terminals.find(n) != grammar->terminals.end()) continue;

    grammar->undef.insert(n);
  }

  for (auto&& u : grammar->undef) {
    fmt::print(std::cerr, "undefined symbol '{}'", u);
    std::cerr << std::endl;
  }
}